

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O0

void __thiscall Assimp::Q3BSPFileParser::getVertices(Q3BSPFileParser *this)

{
  reference ppsVar1;
  sQ3BSPVertex *psVar2;
  value_type __dest;
  reference __src;
  reference ppsVar3;
  sQ3BSPVertex *pVertex;
  size_t idx;
  size_t Offset;
  Q3BSPFileParser *this_local;
  
  ppsVar1 = std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>::
            operator[](&this->m_pModel->m_Lumps,10);
  idx = (size_t)(*ppsVar1)->iOffset;
  pVertex = (sQ3BSPVertex *)0x0;
  while( true ) {
    psVar2 = (sQ3BSPVertex *)
             std::
             vector<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>::
             size(&this->m_pModel->m_Vertices);
    if (psVar2 <= pVertex) break;
    __dest = (value_type)operator_new(0x2c);
    __src = std::vector<char,_std::allocator<char>_>::operator[](&this->m_Data,idx);
    memcpy(__dest,__src,0x2c);
    idx = idx + 0x2c;
    ppsVar3 = std::
              vector<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
              ::operator[](&this->m_pModel->m_Vertices,(size_type)pVertex);
    *ppsVar3 = __dest;
    pVertex = (sQ3BSPVertex *)((long)&(pVertex->vPosition).x + 1);
  }
  return;
}

Assistant:

void Q3BSPFileParser::getVertices()
{
    size_t Offset = m_pModel->m_Lumps[ kVertices ]->iOffset;
    for ( size_t idx = 0; idx < m_pModel->m_Vertices.size(); idx++ )
    {
        sQ3BSPVertex *pVertex = new sQ3BSPVertex;
        memcpy( pVertex, &m_Data[ Offset ], sizeof( sQ3BSPVertex ) );
        Offset += sizeof( sQ3BSPVertex );
        m_pModel->m_Vertices[ idx ] = pVertex;
    }
}